

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

size_t __thiscall
andres::View<float,_true,_std::allocator<unsigned_long>_>::strides
          (View<float,_true,_std::allocator<unsigned_long>_> *this,size_t dimension)

{
  runtime_error *this_00;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    if (dimension < (this->geometry_).dimension_) {
      return (this->geometry_).strides_[dimension];
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline const std::size_t
View<T, isConst, A>::strides
(
    const std::size_t dimension
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || data_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || dimension < this->dimension());
    return geometry_.strides(dimension);
}